

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O3

void __thiscall
nodecpp::platform::internal_msg::InternalMsg::append(InternalMsg *this,void *buff_,size_t sz)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t *buff;
  uint8_t *__dest;
  ulong __n;
  bool bVar3;
  
  if (sz != 0) {
    bVar3 = (this->currentPage).ptr == (uint8_t *)0x0;
    do {
      if (bVar3) {
        if (this->totalSz == 0) {
          reserveSpaceForConvertionToTag(this);
        }
        else {
          implAddPage(this);
        }
        if ((this->currentPage).ptr == (uint8_t *)0x0) {
          assert::onAssertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                     ,0x1f2,"currentPage.page() != nullptr",true);
        }
      }
      uVar2 = (ulong)((uint)this->totalSz & 0xfff);
      __n = 0x1000 - uVar2;
      __dest = (this->currentPage).ptr + uVar2;
      uVar2 = sz - __n;
      if (sz < __n || uVar2 == 0) {
        memcpy(__dest,buff_,sz);
        uVar2 = this->totalSz + sz;
        this->totalSz = uVar2;
        if (sz != __n) {
          return;
        }
        if ((uVar2 & 0xfff) != 0) {
          assert::onAssertionFailed
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                     ,0x1fb,"offsetInCurrentPage() == 0",true);
        }
        (this->currentPage).ptr = (uint8_t *)0x0;
        return;
      }
      memcpy(__dest,buff_,__n);
      uVar1 = this->totalSz + __n;
      this->totalSz = uVar1;
      if ((uVar1 & 0xfff) != 0) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                   ,0x206,"offsetInCurrentPage() == 0",true);
      }
      buff_ = (void *)((long)buff_ + __n);
      (this->currentPage).ptr = (uint8_t *)0x0;
      bVar3 = true;
      sz = uVar2;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void append( const void* buff_, size_t sz )
		{
			const uint8_t* buff = reinterpret_cast<const uint8_t*>(buff_);
			while( sz != 0 )
			{
				if ( currentPage.page() == nullptr )
				{
					if ( totalSz )
						implAddPage();
					else
					{
						NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() == nullptr );
						reserveSpaceForConvertionToTag();
					}
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() != nullptr );
				}
				size_t remainingInPage = remainingSizeInCurrentPage();
				if ( sz <= remainingInPage )
				{
					memcpy( currentPage.page() + offsetInCurrentPage(), buff, sz );
					totalSz += sz;
					if( sz == remainingInPage )
					{
						NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
						currentPage.init();
					}
					break;
				}
				else
				{
					memcpy( currentPage.page() + offsetInCurrentPage(), buff, remainingInPage );
					sz -= remainingInPage;
					buff += remainingInPage;
					totalSz += remainingInPage;
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
					currentPage.init();
				}
			}
		}